

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  ZSTD_fseCTables_t *pZVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  U32 UVar4;
  ZSTD_strategy ZVar5;
  HUF_repeat HVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  uint *puVar8;
  symbolEncodingType_e sVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  U32 *pUVar17;
  ulong uVar18;
  BYTE *pBVar19;
  ulong uVar20;
  long lVar21;
  size_t sVar22;
  uint uVar23;
  rawSeqStore_t *rawSeqStore;
  size_t sVar24;
  FSE_CTable *pFVar25;
  seqStore_t *psVar26;
  BYTE *istart;
  byte *pbVar27;
  byte *pbVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  uint max;
  byte local_1a1;
  size_t local_1a0;
  BYTE *local_198;
  seqStore_t *local_190;
  ZSTD_compressedBlockState_t *local_188;
  uint *local_180;
  ZSTD_compressedBlockState_t *local_178;
  ZSTD_fseCTables_t *local_170;
  U32 *local_168;
  symbolEncodingType_e local_15c;
  seqDef *local_158;
  ulong local_150;
  BYTE *local_148;
  BYTE *local_140;
  ulong local_138;
  BYTE *local_130;
  seqDef *local_128;
  ZSTD_fseCTables_t *local_120;
  byte *local_118;
  size_t local_110;
  uint count [53];
  
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar7 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar7->entropy;
    uVar14 = (int)src - *(int *)&(zc->blockState).matchState.window.base;
    UVar4 = (zc->blockState).matchState.nextToUpdate;
    if (UVar4 + 0x180 < uVar14) {
      uVar23 = (uVar14 - UVar4) - 0x180;
      if (0xbf < uVar23) {
        uVar23 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar14 - uVar23;
    }
    iVar16 = 1;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      iVar16 = (uint)((zc->blockState).matchState.dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
    }
    ms = &(zc->blockState).matchState;
    psVar26 = &zc->seqStore;
    pUVar17 = ((zc->blockState).nextCBlock)->rep;
    lVar21 = 0;
    do {
      pUVar17[lVar21] = pZVar7->rep[lVar21];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    local_180 = (uint *)dst;
    local_1a0 = dstCapacity;
    local_190 = psVar26;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      rawSeqStore = &zc->externSeqStore;
LAB_004d04ce:
      __n = ZSTD_ldm_blockCompress(rawSeqStore,ms,psVar26,pUVar17,src,srcSize);
    }
    else {
      if ((zc->appliedParams).ldmParams.enableLdm != 0) {
        count[2] = 0;
        count[3] = 0;
        count[4] = 0;
        count[5] = 0;
        count._0_8_ = zc->ldmSequences;
        count._24_8_ = zc->maxNbLdmSequences;
        sVar12 = ZSTD_ldm_generateSequences
                           (&zc->ldmState,(rawSeqStore_t *)count,&(zc->appliedParams).ldmParams,src,
                            srcSize);
        if (0xffffffffffffff88 < sVar12) {
          return sVar12;
        }
        pUVar17 = ((zc->blockState).nextCBlock)->rep;
        rawSeqStore = (rawSeqStore_t *)count;
        goto LAB_004d04ce;
      }
      __n = (**(code **)((long)ZSTD_selectBlockCompressor::blockCompressor[0] +
                        (long)(int)(zc->appliedParams).cParams.strategy * 8 +
                        (ulong)(uint)(iVar16 * 0x50)))(ms,psVar26,pUVar17,src,srcSize);
    }
    local_110 = srcSize;
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - __n)),__n);
    pBVar19 = (zc->seqStore).lit + __n;
    (zc->seqStore).lit = pBVar19;
    local_178 = (zc->blockState).prevCBlock;
    local_188 = (zc->blockState).nextCBlock;
    local_1a1 = 0x39 < (zc->appliedParams).cParams.windowLog;
    ZVar5 = (zc->appliedParams).cParams.strategy;
    local_150 = (ulong)ZVar5;
    local_198 = (zc->seqStore).litStart;
    uVar20 = (long)pBVar19 - (long)local_198;
    bVar29 = true;
    if (ZVar5 == ZSTD_fast) {
      bVar29 = (zc->appliedParams).cParams.targetLength == 0;
    }
    local_128 = (zc->seqStore).sequencesStart;
    local_158 = (zc->seqStore).sequences;
    local_168 = zc->entropyWorkspace;
    local_170 = (ZSTD_fseCTables_t *)(ulong)(uint)zc->bmi2;
    local_148 = (zc->seqStore).ofCode;
    bVar13 = 6;
    if (ZSTD_btopt < ZVar5) {
      bVar13 = (char)ZVar5 - 1;
    }
    local_140 = (zc->seqStore).llCode;
    local_130 = (zc->seqStore).mlCode;
    memcpy(local_188,local_178,0x404);
    if (bVar29) {
      HVar6 = (local_178->entropy).huf.repeatMode;
      uVar18 = 0x3f;
      if (HVar6 == HUF_repeat_valid) {
        uVar18 = 6;
      }
      if (uVar20 <= uVar18) goto LAB_004d07c6;
      uVar18 = ((ulong)(0x3ff < uVar20) - (ulong)(uVar20 < 0x4000)) + 4;
      sVar24 = 0xffffffffffffffba;
      sVar22 = local_1a0 - uVar18;
      sVar12 = local_1a0;
      if (uVar18 <= local_1a0 && sVar22 != 0) {
        bVar29 = uVar20 < 0x401 && (uint)local_150 < 4;
        max = HVar6;
        if (uVar18 == 3 && HVar6 == HUF_repeat_valid || uVar20 < 0x100) {
          uVar10 = HUF_compress1X_repeat
                             ((void *)((long)local_180 + uVar18),sVar22,local_198,uVar20,0xff,0xb,
                              local_168,0x1800,(HUF_CElt *)local_188,&max,(uint)bVar29,
                              (int)local_170);
        }
        else {
          uVar10 = HUF_compress4X_repeat
                             ((void *)((long)local_180 + uVar18),sVar22,local_198,uVar20,0xff,0xb,
                              local_168,0x1800,(HUF_CElt *)local_188,&max,(uint)bVar29,
                              (int)local_170);
        }
        puVar8 = local_180;
        uVar14 = 3 - (max == 0);
        if ((uVar20 - (uVar20 >> (bVar13 & 0x3f))) - 2 <= uVar10 || 0xffffffffffffff87 < uVar10 - 1)
        {
          memcpy(local_188,local_178,0x404);
          goto LAB_004d07c6;
        }
        iVar16 = (int)uVar20;
        if (uVar10 != 1) {
          if (max == 0) {
            (local_188->entropy).huf.repeatMode = HUF_repeat_check;
          }
          iVar15 = (int)uVar10;
          if (uVar18 == 5) {
            *local_180 = iVar15 * 0x400000 + iVar16 * 0x10 | uVar14 | 0xc;
            *(char *)(local_180 + 1) = (char)(uVar10 >> 10);
          }
          else if (uVar18 == 4) {
            *local_180 = iVar15 * 0x40000 + iVar16 * 0x10 | uVar14 | 8;
          }
          else {
            iVar16 = iVar15 * 0x4000 +
                     ((uVar14 | iVar16 * 0x10 +
                                (uint)(uVar18 == 3 && HVar6 == HUF_repeat_valid || uVar20 < 0x100) *
                                4) ^ 4);
            *(short *)local_180 = (short)iVar16;
            *(char *)((long)local_180 + 2) = (char)((uint)iVar16 >> 0x10);
          }
          sVar24 = uVar10 + uVar18;
          sVar12 = local_1a0;
          goto LAB_004d07e6;
        }
        memcpy(local_188,local_178,0x404);
        lVar21 = ((ulong)(0x1f < uVar20) + 1) - (ulong)(uVar20 < 0x1000);
        lVar11 = lVar21 + 1;
        if (lVar11 == 3) {
          *puVar8 = iVar16 << 4 | 0xd;
        }
        else if ((int)lVar11 == 2) {
          *(ushort *)puVar8 = (ushort)(iVar16 << 4) | 5;
        }
        else {
          *(char *)puVar8 = (char)uVar20 * '\b' + '\x01';
        }
        *(BYTE *)((long)puVar8 + lVar11) = *local_198;
        sVar12 = local_1a0;
        uVar20 = (ulong)((int)lVar21 + 2);
        goto LAB_004d07f3;
      }
    }
    else {
LAB_004d07c6:
      sVar12 = local_1a0;
      sVar24 = ZSTD_noCompressLiterals(local_180,local_1a0,local_198,uVar20);
LAB_004d07e6:
      uVar20 = sVar24;
      if (sVar24 < 0xffffffffffffff89) {
LAB_004d07f3:
        puVar8 = local_180;
        pZVar7 = local_188;
        sVar24 = 0xffffffffffffffba;
        if (3 < (long)(sVar12 - uVar20)) {
          uVar18 = (long)local_158 - (long)local_128 >> 3;
          pbVar27 = (byte *)(uVar20 + (long)local_180);
          if (uVar18 < 0x7f) {
            *pbVar27 = (byte)uVar18;
            pbVar27 = pbVar27 + 1;
          }
          else if (uVar18 < 0x7f00) {
            *pbVar27 = (byte)(uVar18 >> 8) | 0x80;
            pbVar27[1] = (byte)uVar18;
            pbVar27 = pbVar27 + 2;
          }
          else {
            *pbVar27 = 0xff;
            *(short *)(pbVar27 + 1) = (short)uVar18 + -0x7f00;
            pbVar27 = pbVar27 + 3;
          }
          pZVar1 = &(local_188->entropy).fse;
          if (local_158 == local_128) {
            memcpy(pZVar1,&(local_178->entropy).fse,0xde0);
            local_180 = puVar8;
LAB_004d0cc2:
            sVar24 = (long)pbVar27 - (long)local_180;
            sVar12 = local_1a0;
            if (sVar24 == 0) goto LAB_004d0d24;
          }
          else {
            local_158 = (seqDef *)(local_188->entropy).fse.litlengthCTable;
            local_198 = (BYTE *)((long)local_180 + sVar12);
            pbVar28 = pbVar27 + 1;
            local_170 = pZVar1;
            local_118 = pbVar27;
            ZSTD_seqToCodes(local_190);
            pUVar17 = local_168;
            max = 0x23;
            sVar24 = 0x4d08e6;
            sVar12 = HIST_countFast_wksp(count,&max,local_140,uVar18,local_168,0x1800);
            (pZVar7->entropy).fse.litlength_repeatMode =
                 (local_178->entropy).fse.litlength_repeatMode;
            pFVar25 = (local_178->entropy).fse.litlengthCTable;
            local_15c = ZSTD_selectEncodingType
                                  (&(pZVar7->entropy).fse.litlength_repeatMode,count,max,sVar12,
                                   uVar18,9,pFVar25,LL_defaultNorm,6,ZSTD_defaultAllowed,
                                   (ZSTD_strategy)local_150);
            local_190 = (seqStore_t *)pbVar28;
            sVar24 = ZSTD_buildCTable(pbVar28,(long)local_198 - (long)pbVar28,&local_158->offset,9,
                                      local_15c,count,max,local_140,uVar18,LL_defaultNorm,6,0x23,
                                      pFVar25,0x524,pUVar17,sVar24);
            pZVar7 = local_178;
            sVar12 = local_1a0;
            if (sVar24 < 0xffffffffffffff89) {
              pbVar28 = (byte *)((long)local_190 + sVar24);
              local_120 = &(local_178->entropy).fse;
              max = 0x1f;
              sVar24 = 0x4d0a04;
              sVar12 = HIST_countFast_wksp(count,&max,local_148,uVar18,pUVar17,0x1800);
              pZVar1 = local_120;
              (local_188->entropy).fse.offcode_repeatMode = (pZVar7->entropy).fse.offcode_repeatMode
              ;
              sVar9 = ZSTD_selectEncodingType
                                (&(local_188->entropy).fse.offcode_repeatMode,count,max,sVar12,
                                 uVar18,8,local_120->offcodeCTable,OF_defaultNorm,5,
                                 (uint)(max < 0x1d),(ZSTD_strategy)local_150);
              local_138 = (ulong)sVar9;
              sVar24 = ZSTD_buildCTable(pbVar28,(long)local_198 - (long)pbVar28,
                                        local_170->offcodeCTable,8,sVar9,count,max,local_148,uVar18,
                                        OF_defaultNorm,5,0x1c,pZVar1->offcodeCTable,0x304,pUVar17,
                                        sVar24);
              pZVar7 = local_188;
              sVar12 = local_1a0;
              if (sVar24 < 0xffffffffffffff89) {
                pbVar27 = pbVar28 + sVar24;
                psVar26 = (seqStore_t *)(byte *)0x0;
                if (local_15c == set_compressed) {
                  psVar26 = local_190;
                }
                if ((int)local_138 == 2) {
                  psVar26 = (seqStore_t *)pbVar28;
                }
                local_190 = (seqStore_t *)(local_188->entropy).fse.matchlengthCTable;
                max = 0x34;
                sVar22 = 0x4d0b2d;
                sVar12 = HIST_countFast_wksp(count,&max,local_130,uVar18,local_168,0x1800);
                (pZVar7->entropy).fse.matchlength_repeatMode =
                     (local_178->entropy).fse.matchlength_repeatMode;
                pFVar25 = (local_178->entropy).fse.matchlengthCTable;
                sVar9 = ZSTD_selectEncodingType
                                  (&(pZVar7->entropy).fse.matchlength_repeatMode,count,max,sVar12,
                                   uVar18,9,pFVar25,ML_defaultNorm,6,ZSTD_defaultAllowed,
                                   (ZSTD_strategy)local_150);
                pBVar19 = local_130;
                sVar24 = ZSTD_buildCTable(pbVar27,(long)local_198 - (long)pbVar27,
                                          (FSE_CTable *)local_190,9,sVar9,count,max,local_130,uVar18
                                          ,ML_defaultNorm,6,0x34,pFVar25,0x5ac,local_168,sVar22);
                if (sVar9 == set_compressed) {
                  psVar26 = (seqStore_t *)pbVar27;
                }
                sVar12 = local_1a0;
                if (sVar24 < 0xffffffffffffff89) {
                  pbVar27 = pbVar27 + sVar24;
                  *local_118 = (char)((int)local_138 << 4) + (char)(local_15c << 6) +
                               (char)sVar9 * '\x04';
                  sVar24 = ZSTD_encodeSequences
                                     (pbVar27,(long)local_198 - (long)pbVar27,
                                      (FSE_CTable *)local_190,pBVar19,local_170->offcodeCTable,
                                      local_148,&local_158->offset,local_140,local_128,uVar18,
                                      (uint)local_1a1,(int)sVar22);
                  sVar12 = local_1a0;
                  if (sVar24 < 0xffffffffffffff89) {
                    pbVar27 = pbVar27 + sVar24;
                    if ((psVar26 != (seqStore_t *)0x0) && ((long)pbVar27 - (long)psVar26 < 4))
                    goto LAB_004d0d24;
                    goto LAB_004d0cc2;
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((sVar12 < local_110) || (sVar24 != 0xffffffffffffffba)) {
      if (0xffffffffffffff88 < sVar24) goto LAB_004d0d27;
      ZVar5 = (zc->appliedParams).cParams.strategy;
      bVar13 = 6;
      if (ZSTD_btopt < ZVar5) {
        bVar13 = (char)ZVar5 - 1;
      }
      if (sVar24 < (local_110 - (local_110 >> (bVar13 & 0x3f))) - 2) {
        uVar2 = (zc->blockState).prevCBlock;
        uVar3 = (zc->blockState).nextCBlock;
        auVar30._8_4_ = (int)uVar2;
        auVar30._0_8_ = uVar3;
        auVar30._12_4_ = (int)((ulong)uVar2 >> 0x20);
        (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
        (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar30._8_8_;
        goto LAB_004d0d27;
      }
    }
  }
LAB_004d0d24:
  sVar24 = 0;
LAB_004d0d27:
  pZVar7 = (zc->blockState).prevCBlock;
  if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return sVar24;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}